

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float128_sqrt_m68k(float128 a,float_status *status)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint32_t bLow;
  long lVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint32_t aLow;
  uint uVar13;
  ulong uVar14;
  uint32_t aLow_1;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  float128 fVar23;
  int32_t aExp;
  uint local_44;
  uint64_t local_40;
  ulong local_38;
  
  uVar6 = a.high;
  local_40 = a.low;
  local_38 = uVar6 & 0xffffffffffff;
  local_44 = a.high._6_2_ & 0x7fff;
  if (local_44 == 0x7fff) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) != (undefined1  [16])0x0 ||
        local_40 != 0) {
      fVar23 = propagateFloat128NaN(a,a,status);
      return fVar23;
    }
    if (-1 < (long)uVar6) {
      return a;
    }
LAB_006cc9a2:
    status->float_exception_flags = status->float_exception_flags | 1;
    fVar23.high = 0x7fffffffffffffff;
    fVar23.low = 0xffffffffffffffff;
    return fVar23;
  }
  if ((long)uVar6 < 0) {
    if ((((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0 &&
        local_40 == 0) &&
        ((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0) {
      return a;
    }
    goto LAB_006cc9a2;
  }
  if (((undefined1  [16])a & (undefined1  [16])0x7fff000000000000) == (undefined1  [16])0x0) {
    if (((undefined1  [16])a & (undefined1  [16])0xffffffffffff) == (undefined1  [16])0x0 &&
        local_40 == 0) {
      return (float128)ZEXT816(0);
    }
    normalizeFloat128Subnormal(local_38,local_40,(int32_t *)&local_44,&local_38,&local_40);
  }
  uVar6 = (local_38 | 0x1000000000000) >> 0x11;
  uVar5 = (uint)uVar6;
  uVar13 = (uint)(local_38 >> 0x20);
  if ((local_44 & 1) == 0) {
    uVar10 = ((uVar13 & 0x1fffc | 0x10000) >> 2 | 0x8000) -
             (uint)*(ushort *)
                    (estimateSqrt32_sqrtEvenAdjustments + (ulong)((uVar13 & 0xf000) >> 0xc) * 2);
    uVar10 = (int)(((local_38 & 0x1fffffffe0000 | 0x1000000000000) >> 0x11) / (ulong)uVar10) +
             uVar10;
    uVar13 = 0xffff8000;
    if (uVar10 < 0x20000) {
      uVar13 = uVar10 * 0x8000;
    }
    if (uVar13 <= uVar5) {
      uVar5 = (int)uVar5 >> 1;
      goto LAB_006cca02;
    }
  }
  else {
    uVar13 = (((uVar13 & 0x1fffc | 0x10000) >> 2) -
             (uint)*(ushort *)
                    (estimateSqrt32_sqrtOddAdjustments + (ulong)((uVar13 & 0xf000) >> 0xc) * 2)) +
             0x4000;
    uVar13 = uVar13 * 0x8000 +
             (int)(((local_38 & 0x1fffffffe0000 | 0x1000000000000) >> 0x11) / (ulong)uVar13) *
             0x4000;
    uVar6 = (ulong)(uVar5 >> 1);
  }
  uVar5 = (uVar13 >> 1) + (int)(((uVar6 & 0xffffffff) << 0x1f) / (ulong)uVar13);
LAB_006cca02:
  bVar4 = (byte)(local_44 & 1);
  uVar11 = local_40 << (bVar4 ^ 0xd);
  uVar12 = CONCAT44(0,uVar5);
  bVar4 = bVar4 + 0x33 & 0x3f;
  uVar14 = local_40 >> bVar4 | (local_38 | 0x1000000000000) << 0x40 - bVar4;
  uVar6 = 0xffffffffffffffff;
  if (uVar14 < uVar12 << 0x20) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar12;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar14;
    uVar15 = SUB168(auVar2 / auVar1,0) << 0x20;
    for (lVar3 = uVar14 - SUB164(auVar2 / auVar1,0) * uVar12; lVar3 < 0; lVar3 = lVar3 + uVar12) {
      uVar15 = uVar15 - 0x100000000;
    }
    uVar6 = lVar3 << 0x20 | uVar11 >> 0x20;
    if (uVar6 < uVar12 << 0x20) {
      uVar6 = uVar6 / uVar12;
    }
    else {
      uVar6 = 0xffffffff;
    }
    uVar6 = uVar6 | uVar15;
  }
  uVar6 = uVar12 * 0x40000000 + uVar6;
  uVar15 = uVar6 >> 0x20;
  uVar7 = (uVar6 & 0xffffffff) * uVar15;
  uVar16 = uVar7 >> 0x1f;
  uVar19 = uVar6 * uVar6;
  uVar12 = uVar11 - uVar19;
  lVar3 = ((uVar14 - (uVar11 < uVar19)) -
          ((uVar16 & 0xffffffff) + uVar15 * uVar15 + (uVar16 & 0x100000000))) -
          (ulong)(uVar19 < uVar7 << 0x21);
  uVar11 = uVar6 * 2;
  for (; lVar3 < 0; lVar3 = (lVar3 - ((long)uVar6 >> 0x3f)) + (ulong)bVar21) {
    uVar6 = uVar6 - 1;
    bVar21 = CARRY8(uVar12,uVar11 - 1);
    uVar12 = uVar12 + (uVar11 - 1);
    uVar11 = uVar11 - 2;
  }
  uVar14 = 0xffffffffffffffff;
  if (uVar12 < uVar11) {
    uVar15 = uVar11 >> 0x20;
    uVar14 = 0xffffffff00000000;
    if (uVar12 < (uVar11 & 0xffffffff00000000)) {
      uVar14 = uVar12 / uVar15 << 0x20;
    }
    uVar19 = (uVar14 >> 0x20) * (uVar11 & 0xffffffff);
    uVar7 = uVar14 * uVar11;
    uVar16 = -uVar7;
    lVar3 = ((uVar12 - ((uVar19 >> 0x20) + (uVar14 >> 0x20) * uVar15)) - (ulong)(uVar7 != 0)) -
            (ulong)(uVar7 < uVar19 << 0x20);
    if (lVar3 < 0) {
      uVar7 = (0x100000000 - uVar14) * uVar11;
      uVar19 = uVar16;
      do {
        uVar14 = uVar14 - 0x100000000;
        uVar16 = uVar19 + (uVar11 << 0x20);
        bVar21 = uVar7 < uVar19;
        uVar7 = uVar7 + (uVar11 << 0x20);
        lVar3 = lVar3 + uVar15 + (ulong)bVar21;
        uVar19 = uVar16;
      } while (lVar3 < 0);
    }
    uVar7 = uVar16 >> 0x20 | lVar3 << 0x20;
    if (uVar7 < (uVar11 & 0xffffffff00000000)) {
      uVar7 = uVar7 / uVar15;
    }
    else {
      uVar7 = 0xffffffff;
    }
    uVar14 = uVar7 | uVar14;
    if (((uint)uVar7 & 0x1ffe) < 6) {
      uVar14 = uVar14 + (uVar14 == 0);
      uVar7 = uVar14 >> 0x20;
      uVar20 = (uVar11 & 0xffffffff) * uVar7;
      uVar16 = (uVar14 & 0xffffffff) * uVar15;
      lVar3 = 0;
      uVar19 = uVar16 + uVar20;
      if (CARRY8(uVar16,uVar20)) {
        lVar3 = -0x100000000;
      }
      uVar16 = uVar14 * uVar11;
      uVar18 = (uVar14 & 0xffffffff) * uVar7;
      uVar20 = uVar18 >> 0x1f;
      uVar8 = uVar14 * uVar14;
      uVar17 = (uVar20 & 0xffffffff) + uVar7 * uVar7 + (uVar20 & 0x100000000) +
               (ulong)(uVar8 < uVar18 << 0x21);
      uVar20 = -uVar16 - uVar17;
      uVar9 = -uVar8;
      uVar18 = uVar20 - (uVar8 != 0);
      lVar3 = (((((uVar12 - (uVar16 != 0)) - ((uVar19 >> 0x20) + uVar15 * uVar7)) + lVar3) -
               (ulong)(uVar16 < uVar19 << 0x20)) - (ulong)(-uVar16 < uVar17)) -
              (ulong)(uVar20 < (uVar8 != 0));
      if (lVar3 < 0) {
        uVar12 = uVar14 * 2 - 1;
        do {
          uVar14 = uVar14 - 1;
          uVar15 = uVar14 >> 0x3f | uVar11;
          bVar21 = CARRY8(uVar9,uVar12);
          uVar9 = uVar9 + uVar12;
          bVar22 = CARRY8(uVar18,uVar15);
          uVar15 = uVar18 + uVar15;
          uVar18 = uVar15 + bVar21;
          lVar3 = lVar3 + (ulong)(bVar22 || CARRY8(uVar15,(ulong)bVar21));
          uVar12 = uVar12 - 2;
        } while (lVar3 < 0);
      }
      uVar14 = uVar14 | ((lVar3 != 0 || uVar18 != 0) || uVar9 != 0);
    }
  }
  fVar23 = roundAndPackFloat128
                     ('\0',((int)(local_44 - 0x3fff) >> 1) + 0x3ffe,uVar6 >> 0xe,
                      uVar6 << 0x32 | uVar14 >> 0xe,uVar14 << 0x32,status);
  return fVar23;
}

Assistant:

float128 float128_sqrt(float128 a, float_status *status)
{
    flag aSign;
    int32_t aExp, zExp;
    uint64_t aSig0, aSig1, zSig0, zSig1, zSig2, doubleZSig0;
    uint64_t rem0, rem1, rem2, rem3, term0, term1, term2, term3;

    aSig1 = extractFloat128Frac1( a );
    aSig0 = extractFloat128Frac0( a );
    aExp = extractFloat128Exp( a );
    aSign = extractFloat128Sign( a );
    if ( aExp == 0x7FFF ) {
        if (aSig0 | aSig1) {
            return propagateFloat128NaN(a, a, status);
        }
        if ( ! aSign ) return a;
        goto invalid;
    }
    if ( aSign ) {
        if ( ( aExp | aSig0 | aSig1 ) == 0 ) return a;
 invalid:
        float_raise(float_flag_invalid, status);
        return float128_default_nan(status);
    }
    if ( aExp == 0 ) {
        if ( ( aSig0 | aSig1 ) == 0 ) return packFloat128( 0, 0, 0, 0 );
        normalizeFloat128Subnormal( aSig0, aSig1, &aExp, &aSig0, &aSig1 );
    }
    zExp = ( ( aExp - 0x3FFF )>>1 ) + 0x3FFE;
    aSig0 |= UINT64_C(0x0001000000000000);
    zSig0 = estimateSqrt32( aExp, aSig0>>17 );
    shortShift128Left( aSig0, aSig1, 13 - ( aExp & 1 ), &aSig0, &aSig1 );
    zSig0 = estimateDiv128To64( aSig0, aSig1, zSig0<<32 ) + ( zSig0<<30 );
    doubleZSig0 = zSig0<<1;
    mul64To128( zSig0, zSig0, &term0, &term1 );
    sub128( aSig0, aSig1, term0, term1, &rem0, &rem1 );
    while ( (int64_t) rem0 < 0 ) {
        --zSig0;
        doubleZSig0 -= 2;
        add128( rem0, rem1, zSig0>>63, doubleZSig0 | 1, &rem0, &rem1 );
    }
    zSig1 = estimateDiv128To64( rem1, 0, doubleZSig0 );
    if ( ( zSig1 & 0x1FFF ) <= 5 ) {
        if ( zSig1 == 0 ) zSig1 = 1;
        mul64To128( doubleZSig0, zSig1, &term1, &term2 );
        sub128( rem1, 0, term1, term2, &rem1, &rem2 );
        mul64To128( zSig1, zSig1, &term2, &term3 );
        sub192( rem1, rem2, 0, 0, term2, term3, &rem1, &rem2, &rem3 );
        while ( (int64_t) rem1 < 0 ) {
            --zSig1;
            shortShift128Left( 0, zSig1, 1, &term2, &term3 );
            term3 |= 1;
            term2 |= doubleZSig0;
            add192( rem1, rem2, rem3, 0, term2, term3, &rem1, &rem2, &rem3 );
        }
        zSig1 |= ( ( rem1 | rem2 | rem3 ) != 0 );
    }
    shift128ExtraRightJamming( zSig0, zSig1, 0, 14, &zSig0, &zSig1, &zSig2 );
    return roundAndPackFloat128(0, zExp, zSig0, zSig1, zSig2, status);

}